

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_bad_request(http_client_t *client,unsigned_long code,char *comment,char *msg)

{
  int iVar1;
  char local_128 [4];
  int len;
  char buf [256];
  char *msg_local;
  char *comment_local;
  unsigned_long code_local;
  http_client_t *client_local;
  
  buf._248_8_ = msg;
  iVar1 = snprintf(local_128,0x100,"HTTP/1.0 %lu %s\r\nConnection: close\r\n\r\n%s\r\n",code,comment
                   ,msg);
  write(client->fd,local_128,(long)iVar1);
  return;
}

Assistant:

void http_bad_request(http_client_t *client, 
                      unsigned long code,
                      const char *comment, const char *msg) {
   char buf[256];
   int len;

   len = snprintf(buf, 256,
                  "HTTP/1.0 %lu %s\r\nConnection: close\r\n\r\n%s\r\n", 
                  code, comment, msg);
   write(client->fd, buf, len);
}